

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_iarchive.h
# Opt level: O0

void __thiscall serialization::json_iarchive::load_data(json_iarchive *this,char *data)

{
  ParseErrorCode PVar1;
  char *data_local;
  json_iarchive *this_local;
  
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::Parse(&this->doc_,data);
  PVar1 = rapidjson::
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          ::GetParseError(&this->doc_);
  if (PVar1 != kParseErrorNone) {
    throw_serialization_error("json","parse");
  }
  return;
}

Assistant:

void load_data(const char * data)
    {
        doc_.Parse(data);
        if(doc_.GetParseError())
        {
            throw_serialization_error("json", "parse");
        }
    }